

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O0

bool Js::UriHelper::DecodeByteFromHex(char16 digit1,char16 digit2,uchar *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint local_1c;
  uchar *puStack_18;
  int x;
  uchar *value_local;
  char16 digit2_local;
  char16 digit1_local;
  
  puStack_18 = value;
  value_local._2_2_ = digit2;
  value_local._4_2_ = digit1;
  BVar3 = NumberUtilities::FHexDigit(digit1,(int *)&local_1c);
  if (BVar3 == 0) {
    value_local._7_1_ = false;
  }
  else {
    if (0xf < local_1c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0x240,"(static_cast<unsigned int>(x) <= 0xfU)",
                                  "static_cast<unsigned int>(x) <= 0xfU");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    *puStack_18 = (uchar)((local_1c & 0xff) << 4);
    BVar3 = NumberUtilities::FHexDigit(value_local._2_2_,(int *)&local_1c);
    if (BVar3 == 0) {
      value_local._7_1_ = false;
    }
    else {
      if (0xf < local_1c) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                    ,0x247,"(static_cast<unsigned int>(x) <= 0xfU)",
                                    "static_cast<unsigned int>(x) <= 0xfU");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      *puStack_18 = *puStack_18 + (char)local_1c;
      value_local._7_1_ = true;
    }
  }
  return value_local._7_1_;
}

Assistant:

bool UriHelper::DecodeByteFromHex(const char16 digit1, const char16 digit2, unsigned char &value)
    {
        int x;
        if(!Js::NumberUtilities::FHexDigit(digit1, &x))
        {
            return false;
        }
        Assert(static_cast<unsigned int>(x) <= 0xfU);
        value = static_cast<unsigned char>(x) << 4;

        if(!Js::NumberUtilities::FHexDigit(digit2, &x))
        {
            return false;
        }
        Assert(static_cast<unsigned int>(x) <= 0xfU);
        value += static_cast<unsigned char>(x);

        return true;
    }